

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O0

int __thiscall CTcSymObjBase::write_to_obj_file_main(CTcSymObjBase *this,CVmFile *fp)

{
  uint uVar1;
  int iVar2;
  CVmFile *this_00;
  CTcSymObjBase *in_RSI;
  CTcSymObjBase *in_RDI;
  int cnt;
  CTcObjPropDel *delprop;
  char buf [32];
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  CTcDictEntry *in_stack_ffffffffffffff80;
  CVmFile *in_stack_ffffffffffffff88;
  CTcSymObjBase *buf_00;
  CVmFile *in_stack_ffffffffffffff90;
  CTcIdFixup *head;
  CVmFile *in_stack_ffffffffffffffa0;
  bool local_51;
  CTcObjPropDel *local_40;
  undefined1 local_38 [4];
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  undefined1 local_30;
  bool local_2f;
  undefined1 local_2e;
  undefined1 auStack_2d [2];
  CVmFile CStack_2b;
  CVmFile *in_stack_ffffffffffffffe8;
  CTcSymObjBase *pCVar3;
  
  uVar1 = CTcParser::get_next_obj_file_sym_idx(G_prs);
  set_obj_file_idx(in_RDI,uVar1);
  if (in_RDI->dict_ != (CTcDictEntry *)0x0) {
    CTcDictEntry::write_sym_to_obj_file
              (in_stack_ffffffffffffff80,
               (CVmFile *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  if ((*(ushort *)&in_RDI->field_0xb8 >> 9 & 1) == 0) {
    CTcSymbolBase::write_to_file_gen
              ((CTcSymbolBase *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  ::oswp4(local_38,in_RDI->obj_id_);
  local_34 = (*(ushort *)&in_RDI->field_0xb8 & 1) != 0;
  local_33 = (*(ushort *)&in_RDI->field_0xb8 >> 3 & 1) != 0;
  local_32 = (*(ushort *)&in_RDI->field_0xb8 >> 4 & 1) != 0;
  local_31 = in_RDI->mod_base_sym_ != (CTcSymObj *)0x0;
  local_30 = (*(ushort *)&in_RDI->field_0xb8 >> 2 & 1) != 0;
  local_51 = false;
  if (in_RDI->obj_stm_ != (CTPNStmObject *)0x0) {
    iVar2 = CTPNStmObjectBase::is_class(&in_RDI->obj_stm_->super_CTPNStmObjectBase);
    local_51 = iVar2 != 0;
  }
  local_2f = local_51;
  local_2e = (*(ushort *)&in_RDI->field_0xb8 >> 0xb & 1) != 0;
  ::oswp2(auStack_2d,in_RDI->metaclass_);
  if (in_RDI->dict_ == (CTcDictEntry *)0x0) {
    ::oswp2(&CStack_2b,0);
  }
  else {
    in_stack_ffffffffffffffa0 = &CStack_2b;
    uVar1 = CTcDictEntry::get_obj_idx(in_RDI->dict_);
    ::oswp2(in_stack_ffffffffffffffa0,uVar1);
  }
  head = (CTcIdFixup *)((long)&CStack_2b.fp_ + 2);
  uVar1 = get_obj_file_idx(in_RDI);
  ::oswp2(head,uVar1);
  CVmFile::write_bytes
            (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
             (size_t)in_stack_ffffffffffffff80);
  if ((*(ushort *)&in_RDI->field_0xb8 & 1) == 0) {
    CVmFile::write_uint4((CVmFile *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (in_RDI->mod_base_sym_ != (CTcSymObj *)0x0) {
    for (local_40 = in_RDI->first_del_prop_; local_40 != (CTcObjPropDel *)0x0;
        local_40 = local_40->nxt_) {
    }
    CVmFile::write_uint2((CVmFile *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    for (local_40 = in_RDI->first_del_prop_; local_40 != (CTcObjPropDel *)0x0;
        local_40 = local_40->nxt_) {
      buf_00 = in_RSI;
      CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x20ea09);
      CVmFile::write_uint2((CVmFile *)in_RSI,in_stack_ffffffffffffff7c);
      pCVar3 = buf_00;
      this_00 = (CVmFile *)CTcSymbolBase::get_sym((CTcSymbolBase *)0x20ea2c);
      CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x20ea3e);
      CVmFile::write_bytes(this_00,(char *)buf_00,(size_t)in_RSI);
      in_RSI = pCVar3;
    }
  }
  CTcIdFixup::write_to_object_file(in_stack_ffffffffffffffa0,head);
  if (in_RDI->mod_base_sym_ != (CTcSymObj *)0x0) {
    write_to_obj_file_main(in_RSI,in_stack_ffffffffffffffe8);
  }
  *(ushort *)&in_RDI->field_0xb8 = *(ushort *)&in_RDI->field_0xb8 & 0xffbf | 0x40;
  return 1;
}

Assistant:

int CTcSymObjBase::write_to_obj_file_main(CVmFile *fp)
{
    /* take the next object file index */
    set_obj_file_idx(G_prs->get_next_obj_file_sym_idx());

    /* 
     *   if I have a dictionary object, make sure it's in the object file
     *   before I am - we need to be able to reference the object during
     *   load, so it has to be written before me 
     */
    if (dict_ != 0)
        dict_->write_sym_to_obj_file(fp);

    /* 
     *   if I'm not anonymous, write the basic header information for the
     *   symbol (don't do this for anonymous objects, since they don't have a
     *   name to write) 
     */
    if (!anon_)
        write_to_file_gen(fp);

    /* 
     *   write my object ID, so that we can translate from the local
     *   numbering system in the object file to the new numbering system in
     *   the image file 
     */
    char buf[32];
    oswp4(buf, obj_id_);

    /* write the flags */
    buf[4] = (is_extern_ != 0);
    buf[5] = (ext_replace_ != 0);
    buf[6] = (modified_ != 0);
    buf[7] = (mod_base_sym_ != 0);
    buf[8] = (ext_modify_ != 0);
    buf[9] = (obj_stm_ != 0 && obj_stm_->is_class());
    buf[10] = (transient_ != 0);

    /* add the metaclass type */
    oswp2(buf + 11, (int)metaclass_);

    /* add the dictionary's object file index, if we have one */
    if (dict_ != 0)
        oswp2(buf + 13, dict_->get_obj_idx());
    else
        oswp2(buf + 13, 0);

    /* 
     *   add my object file index (we store this to eliminate any dependency
     *   on the load order - this allows us to write other symbols
     *   recursively without worrying about exactly where the recursion
     *   occurs relative to assigning the file index) 
     */
    oswp2(buf + 15, get_obj_file_idx());

    /* write the data to the file */
    fp->write_bytes(buf, 17);

    /* if we're not external, write our stream address */
    if (!is_extern_)
        fp->write_uint4(stream_ofs_);

    /* if we're modifying another object, store some extra information */
    if (mod_base_sym_ != 0)
    {
        /* 
         *   Write our list of properties to be deleted from base objects at
         *   link time.  First, count the properties in the list.  
         */
        CTcObjPropDel *delprop;
        int cnt;
        for (cnt = 0, delprop = first_del_prop_ ; delprop != 0 ;
             ++cnt, delprop = delprop->nxt_) ;

        /* write the count */
        fp->write_uint2(cnt);

        /* write the deleted property list */
        for (delprop = first_del_prop_ ; delprop != 0 ;
             delprop = delprop->nxt_)
        {
            /* 
             *   write out this property symbol (we write the symbol rather
             *   than the ID, because when we load the object file, we'll
             *   need to adjust the ID to new global numbering system in the
             *   image file; the easiest way to do this is to write the
             *   symbol and look it up at load time) 
             */
            fp->write_uint2(delprop->prop_sym_->get_sym_len());
            fp->write_bytes(delprop->prop_sym_->get_sym(),
                            delprop->prop_sym_->get_sym_len());
        }
    }

    /* write our self-reference fixup list */
    CTcIdFixup::write_to_object_file(fp, fixups_);

    /*
     *   If this is a modifying object, we must write the entire chain of
     *   modified base objects immediately after this object.  When we're
     *   reading the symbol table, this ensures that we can read each
     *   modified base object recursively as we read its modifiers, which is
     *   necessary so that we can build up the same modification chain on
     *   loading the object file.  
     */
    if (mod_base_sym_ != 0)
    {
        /* write the main part of the definition */
        mod_base_sym_->write_to_obj_file_main(fp);
    }

    /* mark the object as written to the file */
    written_to_obj_ = TRUE;

    /* written */
    return TRUE;
}